

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OISInputManager.cpp
# Opt level: O3

InputManager * OIS::InputManager::createInputSystem(ParamList *paramList)

{
  LinuxInputManager *this;
  
  this = (LinuxInputManager *)operator_new(0xd8);
  LinuxInputManager::LinuxInputManager(this);
  (**(this->super_InputManager)._vptr_InputManager)(this,paramList);
  return &this->super_InputManager;
}

Assistant:

InputManager* InputManager::createInputSystem(ParamList& paramList)
{
	InputManager* im = nullptr;

#if defined OIS_SDL_PLATFORM
	im = new SDLInputManager();
#elif defined OIS_WIN32_PLATFORM
	im = new Win32InputManager();
#elif defined OIS_XBOX_PLATFORM
	im = new XBoxInputManager();
#elif defined OIS_LINUX_PLATFORM
	im = new LinuxInputManager();
#elif defined OIS_APPLE_PLATFORM
	ParamList::iterator i = paramList.find("WINDOW");
	if(i != paramList.end())
	{
		id obj = (id)strtoul(i->second.c_str(), 0, 10);
		if(obj && [obj isKindOfClass:[NSWindow class]])
			im = new CocoaInputManager();
#ifndef __LP64__
		else
			im = new MacInputManager();
#endif
	}
#elif defined OIS_IPHONE_PLATFORM
	im = new iPhoneInputManager();
#else
	OIS_EXCEPT(E_General, "No platform library.. check build platform defines!");
#endif

	try
	{
		im->_initialize(paramList);
	}
	catch(...)
	{
		delete im;
		throw; //rethrow
	}

	return im;
}